

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<bool,proto2_unittest::Proto2MapEnumPlusExtra>
               (Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *dest,
               Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *src)

{
  Proto2MapEnumPlusExtra PVar1;
  Proto2MapEnumPlusExtra *pPVar2;
  const_iterator __begin0;
  UntypedMapIterator local_30;
  
  UntypedMapBase::begin(&local_30,(UntypedMapBase *)src);
  while (local_30.node_ != (NodeBase *)0x0) {
    PVar1 = *(Proto2MapEnumPlusExtra *)((long)&local_30.node_[1].next + 4);
    pPVar2 = Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::operator[]<bool>
                       (dest,(key_arg<bool> *)(local_30.node_ + 1));
    *pPVar2 = PVar1;
    UntypedMapIterator::PlusPlus(&local_30);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}